

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# productquantizer.cc
# Opt level: O1

real __thiscall
fasttext::ProductQuantizer::mulcode
          (ProductQuantizer *this,Vector *x,uint8_t *codes,int32_t t,real alpha)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  real *prVar4;
  ulong uVar5;
  float *pfVar6;
  ulong uVar7;
  ulong uVar8;
  float fVar9;
  
  iVar1 = this->nsubq_;
  if ((long)iVar1 < 1) {
    fVar9 = 0.0;
  }
  else {
    iVar2 = this->dsub_;
    uVar3 = this->lastdsub_;
    pfVar6 = (x->data_).mem_;
    fVar9 = 0.0;
    uVar8 = 0;
    uVar7 = (long)iVar2;
    do {
      prVar4 = get_centroids(this,(int32_t)uVar8,codes[uVar8 + (long)(t * iVar1)]);
      uVar7 = uVar7 & 0xffffffff;
      if (uVar8 == iVar1 - 1) {
        uVar7 = (ulong)uVar3;
      }
      if (0 < (int)uVar7) {
        uVar5 = 0;
        do {
          fVar9 = fVar9 + pfVar6[uVar5] * prVar4[uVar5];
          uVar5 = uVar5 + 1;
        } while (uVar7 != uVar5);
      }
      uVar8 = uVar8 + 1;
      pfVar6 = pfVar6 + iVar2;
    } while (uVar8 != (long)iVar1);
  }
  return fVar9 * alpha;
}

Assistant:

real ProductQuantizer::mulcode(
    const Vector& x,
    const uint8_t* codes,
    int32_t t,
    real alpha) const {
  real res = 0.0;
  auto d = dsub_;
  const uint8_t* code = codes + nsubq_ * t;
  for (auto m = 0; m < nsubq_; m++) {
    const real* c = get_centroids(m, code[m]);
    if (m == nsubq_ - 1) {
      d = lastdsub_;
    }
    for (auto n = 0; n < d; n++) {
      res += x[m * dsub_ + n] * c[n];
    }
  }
  return res * alpha;
}